

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  uint uVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  ImGuiTableSettings *pIVar4;
  long lVar5;
  ImGuiTableColumn *pIVar6;
  ImGuiTableSettings *pIVar7;
  bool bVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  ImGuiContext *g;
  float fVar12;
  
  table->IsSettingsDirty = false;
  pIVar3 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  lVar5 = (long)table->SettingsOffset;
  if (lVar5 != -1) {
    pcVar2 = (GImGui->SettingsTables).Buf.Data;
    pIVar4 = (ImGuiTableSettings *)(pcVar2 + lVar5);
    if (table->ColumnsCount <= (int)pcVar2[lVar5 + 0xd]) goto LAB_00160abb;
    pIVar4->ID = 0;
  }
  pIVar4 = (ImGuiTableSettings *)0x0;
LAB_00160abb:
  if (pIVar4 == (ImGuiTableSettings *)0x0) {
    pIVar4 = TableSettingsCreate(table->ID,table->ColumnsCount);
    table->SettingsOffset = (int)pIVar4 - *(int *)&(pIVar3->SettingsTables).Buf.Data;
  }
  pIVar4->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;
  pIVar6 = (table->Columns).Data;
  pIVar4->SaveFlags = 0;
  if (table->ColumnsCount < 1) {
    pIVar4->SaveFlags = pIVar4->SaveFlags & table->Flags;
    fVar12 = 0.0;
  }
  else {
    pIVar7 = pIVar4 + 1;
    iVar9 = 0;
    bVar8 = false;
    do {
      fVar12 = *(float *)((long)&pIVar6->WidthRequest + (ulong)(pIVar6->Flags & 4) * 2);
      pIVar7->ID = (ImGuiID)fVar12;
      *(char *)&pIVar7->RefScale = (char)iVar9;
      *(ImGuiTableColumnIdx *)((long)&pIVar7->RefScale + 1) = pIVar6->DisplayOrder;
      *(ImGuiTableColumnIdx *)((long)&pIVar7->RefScale + 2) = pIVar6->SortOrder;
      bVar10 = pIVar6->field_0x64 & 3;
      bVar11 = *(byte *)((long)&pIVar7->RefScale + 3);
      *(byte *)((long)&pIVar7->RefScale + 3) = bVar11 & 0xfc | bVar10;
      bVar11 = bVar11 & 0xf8 | bVar10 | pIVar6->IsEnabled << 2;
      *(byte *)((long)&pIVar7->RefScale + 3) = bVar11;
      *(byte *)((long)&pIVar7->RefScale + 3) = bVar11 & 0xf7 | (char)pIVar6->Flags * '\x02' & 8U;
      uVar1 = pIVar6->Flags;
      if ((uVar1 & 4) == 0) {
        bVar8 = true;
      }
      if ((fVar12 != pIVar6->InitStretchWeightOrWidth) ||
         (NAN(fVar12) || NAN(pIVar6->InitStretchWeightOrWidth))) {
        *(byte *)&pIVar4->SaveFlags = (byte)pIVar4->SaveFlags | 1;
      }
      if (iVar9 != pIVar6->DisplayOrder) {
        *(byte *)&pIVar4->SaveFlags = (byte)pIVar4->SaveFlags | 2;
      }
      if (pIVar6->SortOrder != -1) {
        *(byte *)&pIVar4->SaveFlags = (byte)pIVar4->SaveFlags | 8;
      }
      if ((uVar1 & 1) == (uint)pIVar6->IsEnabled) {
        *(byte *)&pIVar4->SaveFlags = (byte)pIVar4->SaveFlags | 4;
      }
      iVar9 = iVar9 + 1;
      pIVar6 = pIVar6 + 1;
      pIVar7 = (ImGuiTableSettings *)&pIVar7->ColumnsCount;
    } while (iVar9 < table->ColumnsCount);
    pIVar4->SaveFlags = pIVar4->SaveFlags & table->Flags;
    fVar12 = 0.0;
    if (bVar8) {
      fVar12 = table->RefScale;
    }
  }
  pIVar4->RefScale = fVar12;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}